

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_band.c
# Opt level: O0

SUNLinearSolver SUNLinSol_Band(N_Vector y,SUNMatrix A,SUNContext_conflict sunctx)

{
  sunindextype sVar1;
  SUNLinearSolver p_Var2;
  sunindextype *psVar3;
  void *pvVar4;
  undefined8 in_RDX;
  SUNMatrix in_RSI;
  sunindextype MatrixRows;
  SUNLinearSolverContent_Band content;
  SUNLinearSolver S;
  SUNContext_conflict sunctx_local_scope_;
  
  sVar1 = SUNBandMatrix_Rows(in_RSI);
  p_Var2 = (SUNLinearSolver)SUNLinSolNewEmpty(in_RDX);
  p_Var2->ops->gettype = SUNLinSolGetType_Band;
  p_Var2->ops->getid = SUNLinSolGetID_Band;
  p_Var2->ops->initialize = SUNLinSolInitialize_Band;
  p_Var2->ops->setup = SUNLinSolSetup_Band;
  p_Var2->ops->solve = SUNLinSolSolve_Band;
  p_Var2->ops->lastflag = SUNLinSolLastFlag_Band;
  p_Var2->ops->space = SUNLinSolSpace_Band;
  p_Var2->ops->free = SUNLinSolFree_Band;
  psVar3 = (sunindextype *)malloc(0x18);
  p_Var2->content = psVar3;
  *psVar3 = sVar1;
  psVar3[2] = 0;
  psVar3[1] = 0;
  pvVar4 = malloc(sVar1 << 3);
  psVar3[1] = (sunindextype)pvVar4;
  return p_Var2;
}

Assistant:

SUNLinearSolver SUNLinSol_Band(SUNDIALS_MAYBE_UNUSED N_Vector y, SUNMatrix A,
                               SUNContext sunctx)
{
  SUNFunctionBegin(sunctx);
  SUNLinearSolver S;
  SUNLinearSolverContent_Band content;
  sunindextype MatrixRows;

  SUNAssertNull(SUNMatGetID(A) == SUNMATRIX_BAND, SUN_ERR_ARG_WRONGTYPE);
  SUNAssertNull(SUNBandMatrix_Rows(A) == SUNBandMatrix_Columns(A),
                SUN_ERR_ARG_DIMSMISMATCH);
  SUNAssertNull(y->ops->nvgetarraypointer, SUN_ERR_ARG_INCOMPATIBLE);

  /* Check that A has appropriate storage upper bandwidth for factorization */
  MatrixRows = SUNBandMatrix_Rows(A);
  SUNAssertNull(SUNBandMatrix_StoredUpperBandwidth(A) >=
                  SUNMIN(MatrixRows - 1, SUNBandMatrix_LowerBandwidth(A) +
                                           SUNBandMatrix_UpperBandwidth(A)),
                SUN_ERR_ARG_INCOMPATIBLE);
  SUNAssertNull(MatrixRows == N_VGetLength(y), SUN_ERR_ARG_DIMSMISMATCH);

  /* Create an empty linear solver */
  S = NULL;
  S = SUNLinSolNewEmpty(sunctx);
  SUNCheckLastErrNull();

  /* Attach operations */
  S->ops->gettype    = SUNLinSolGetType_Band;
  S->ops->getid      = SUNLinSolGetID_Band;
  S->ops->initialize = SUNLinSolInitialize_Band;
  S->ops->setup      = SUNLinSolSetup_Band;
  S->ops->solve      = SUNLinSolSolve_Band;
  S->ops->lastflag   = SUNLinSolLastFlag_Band;
  S->ops->space      = SUNLinSolSpace_Band;
  S->ops->free       = SUNLinSolFree_Band;

  /* Create content */
  content = NULL;
  content = (SUNLinearSolverContent_Band)malloc(sizeof *content);
  SUNAssertNull(content, SUN_ERR_MALLOC_FAIL);

  /* Attach content */
  S->content = content;

  /* Fill content */
  content->N         = MatrixRows;
  content->last_flag = 0;
  content->pivots    = NULL;

  /* Allocate content */
  content->pivots = (sunindextype*)malloc(MatrixRows * sizeof(sunindextype));
  SUNAssertNull(content->pivots, SUN_ERR_MALLOC_FAIL);

  return (S);
}